

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O2

mu_queue * mu_queue_new(int limit)

{
  mu_queue *pmVar1;
  
  pmVar1 = (mu_queue *)calloc(1,(ulong)(limit * 8 + 0x20));
  pmVar1->limit = limit;
  return pmVar1;
}

Assistant:

static mu_queue *mu_queue_new (int limit) {
	mu_queue *q;
	int size = offsetof (struct mu_queue_s, data) + sizeof (q->data[0]) * limit;
	q = (mu_queue *) malloc (size);
	memset ((void *) q, 0, size);
	q->limit = limit;
	return (q);
}